

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O3

Gia_Man_t * Gls_ManConstruct(Gls_Man_t *p,char *pFileName)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_00;
  int *piVar10;
  Gia_Man_t *p_01;
  size_t sVar11;
  char *pcVar12;
  undefined4 *__s;
  Gia_Obj_t *pGVar13;
  Vec_Int_t *pVVar14;
  Vec_Int_t *pVVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  word Truth;
  word local_38;
  
  vMemory = (Vec_Int_t *)calloc(1,0x10);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  p_00->pArray = piVar10;
  p_01 = Gia_ManStart(p->vTypes->nSize);
  if (pFileName == (char *)0x0) {
    p_01->pName = (char *)0x0;
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pFileName);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pFileName);
    p_01->pName = pcVar12;
    sVar11 = strlen(pFileName);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pFileName);
  }
  p_01->pSpec = pcVar12;
  uVar2 = p->vTypes->nSize;
  uVar8 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar8 = uVar2;
  }
  if ((uVar8 == 0) || (__s = (undefined4 *)malloc((long)(int)uVar8 << 2), __s == (undefined4 *)0x0))
  {
    __s = (undefined4 *)0x0;
  }
  else {
    memset(__s,0xff,(long)(int)uVar2 * 4);
  }
  if (((int)uVar2 < 1) || (*__s = 0, uVar2 == 1)) {
LAB_0074cacc:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __s[1] = 1;
  pVVar15 = p->vOrderPis;
  if (0 < pVVar15->nSize) {
    lVar17 = 0;
    do {
      uVar8 = pVVar15->pArray[lVar17];
      pGVar13 = Gia_ManAppendObj(p_01);
      uVar16 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_01->pObjs;
      if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) goto LAB_0074ca8e;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_01->pObjs;
      if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) goto LAB_0074ca8e;
      if (((int)uVar8 < 0) || (uVar2 <= uVar8)) goto LAB_0074cacc;
      __s[uVar8] = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar15 = p->vOrderPis;
    } while (lVar17 < pVVar15->nSize);
  }
  pVVar15 = p->vOrderBoxes;
  if (0 < pVVar15->nSize) {
    lVar17 = 0;
    do {
      uVar8 = pVVar15->pArray[lVar17];
      pGVar13 = Gia_ManAppendObj(p_01);
      uVar16 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_01->pObjs;
      if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) goto LAB_0074ca8e;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_01->pObjs;
      if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) goto LAB_0074ca8e;
      if (((int)uVar8 < 0) || (uVar2 <= uVar8)) goto LAB_0074cacc;
      __s[uVar8] = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar15 = p->vOrderBoxes;
    } while (lVar17 < pVVar15->nSize);
  }
  pVVar15 = p->vOrderDelays;
  if (0 < pVVar15->nSize) {
    uVar16 = 0;
    do {
      iVar9 = pVVar15->pArray[uVar16];
      lVar17 = (long)iVar9;
      if ((lVar17 < 0) || (p->vIndexes->nSize <= iVar9)) goto LAB_0074caad;
      if (uVar16 != (uint)p->vIndexes->pArray[lVar17]) {
        __assert_fail("Index == Vec_IntEntry(p->vIndexes, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGig.c"
                      ,0x195,"Gia_Man_t *Gls_ManConstruct(Gls_Man_t *, char *)");
      }
      if ((long)p->vDelayOuts->nSize <= (long)uVar16) goto LAB_0074cb0a;
      pVVar15 = p->vDelayOuts->pArray;
      if (pVVar15[uVar16].nSize == 0) {
        pGVar13 = Gia_ManAppendObj(p_01);
        uVar6 = *(ulong *)pGVar13;
        *(ulong *)pGVar13 = uVar6 | 0x9fffffff;
        *(ulong *)pGVar13 =
             uVar6 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_01->pObjs;
        if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) {
LAB_0074ca8e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = p_01->pObjs;
        if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) goto LAB_0074ca8e;
        if ((int)uVar2 <= iVar9) goto LAB_0074cacc;
        __s[lVar17] = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * 0x55555556;
      }
      else if (0 < pVVar15[uVar16].nSize) {
        lVar17 = 0;
        do {
          uVar8 = pVVar15[uVar16].pArray[lVar17];
          pGVar13 = Gia_ManAppendObj(p_01);
          uVar6 = *(ulong *)pGVar13;
          *(ulong *)pGVar13 = uVar6 | 0x9fffffff;
          *(ulong *)pGVar13 =
               uVar6 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_01->pObjs;
          if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) goto LAB_0074ca8e;
          Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_01->pObjs;
          if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) goto LAB_0074ca8e;
          if (uVar2 <= uVar8) goto LAB_0074cacc;
          __s[uVar8] = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * 0x55555556;
          lVar17 = lVar17 + 1;
        } while (lVar17 < pVVar15[uVar16].nSize);
      }
      uVar16 = uVar16 + 1;
      pVVar15 = p->vOrderDelays;
    } while ((long)uVar16 < (long)pVVar15->nSize);
  }
  pVVar14 = p->vOrderLuts;
  if (0 < pVVar14->nSize) {
    lVar17 = 0;
    do {
      uVar8 = pVVar14->pArray[lVar17];
      lVar19 = (long)(int)uVar8;
      if ((lVar19 < 0) || (p->vTypes->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar1 = p->vTypes->pArray[lVar19];
      if ((byte)(bVar1 - 7) < 2) {
        if (p->vIndexes->nSize <= (int)uVar8) goto LAB_0074caad;
        uVar3 = p->vIndexes->pArray[lVar19];
        if (bVar1 == 7) {
          if ((int)uVar3 < 0) {
LAB_0074cb29:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if (p->vLut4s->nSize <= (int)(uVar3 * 4)) goto LAB_0074cb29;
          if (p->vLut4TTs->nSize <= (int)uVar3) goto LAB_0074caad;
          piVar10 = p->vLut4s->pArray + uVar3 * 4;
          local_38 = (word)p->vLut4TTs->pArray[uVar3];
          lVar20 = 4;
        }
        else {
          if ((int)uVar3 < 0) goto LAB_0074cb29;
          uVar7 = uVar3 * 6;
          uVar4 = p->vLut6s->nSize;
          if (uVar4 == uVar7 || SBORROW4(uVar4,uVar7) != (int)(uVar4 + uVar3 * -6) < 0)
          goto LAB_0074cb29;
          if (p->vLut6TTs->nSize <= (int)uVar3) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
          }
          piVar10 = p->vLut6s->pArray + uVar7;
          local_38 = p->vLut6TTs->pArray[uVar3];
          lVar20 = 6;
        }
        p_00->nSize = 0;
        lVar18 = 0;
        do {
          uVar3 = piVar10[lVar18];
          if ((ulong)uVar3 == 0xffffffff) {
            iVar9 = 0;
          }
          else {
            if (uVar2 <= uVar3) goto LAB_0074caad;
            iVar9 = __s[uVar3];
          }
          Vec_IntPush(p_00,iVar9);
          lVar18 = lVar18 + 1;
        } while (lVar20 != lVar18);
        iVar9 = Kit_TruthToGia(p_01,(uint *)&local_38,p_00->nSize,vMemory,p_00,0);
        if ((int)uVar2 <= (int)uVar8) goto LAB_0074cacc;
        __s[lVar19] = iVar9;
        pVVar14 = p->vOrderLuts;
      }
      else if ((bVar1 & 0xfd) == 4) {
        if ((p->vIndexes->nSize <= (int)uVar8) ||
           (uVar3 = p->vIndexes->pArray[lVar19], uVar2 <= uVar3)) goto LAB_0074caad;
        if (uVar2 <= uVar8) goto LAB_0074cacc;
        __s[lVar19] = __s[uVar3];
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar14->nSize);
    pVVar15 = p->vOrderDelays;
  }
  if (0 < pVVar15->nSize) {
    lVar17 = 0;
    do {
      if (p->vDelayIns->nSize <= lVar17) {
LAB_0074cb0a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar15 = p->vDelayIns->pArray;
      if (pVVar15[lVar17].nSize < 1) {
        __assert_fail("Vec_IntSize(vArray) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGig.c"
                      ,0x1b7,"Gia_Man_t *Gls_ManConstruct(Gls_Man_t *, char *)");
      }
      lVar19 = 0;
      do {
        if (uVar2 <= (uint)pVVar15[lVar17].pArray[lVar19]) goto LAB_0074caad;
        Gia_ManAppendCo(p_01,__s[(uint)pVVar15[lVar17].pArray[lVar19]]);
        lVar19 = lVar19 + 1;
      } while (lVar19 < pVVar15[lVar17].nSize);
      lVar17 = lVar17 + 1;
    } while (lVar17 < p->vOrderDelays->nSize);
  }
  pVVar15 = p->vOrderPos;
  if (0 < pVVar15->nSize) {
    lVar17 = 0;
    do {
      iVar9 = pVVar15->pArray[lVar17];
      if ((((long)iVar9 < 0) || (p->vIndexes->nSize <= iVar9)) ||
         (uVar8 = p->vIndexes->pArray[iVar9], uVar2 <= uVar8)) goto LAB_0074caad;
      Gia_ManAppendCo(p_01,__s[uVar8]);
      lVar17 = lVar17 + 1;
      pVVar15 = p->vOrderPos;
    } while (lVar17 < pVVar15->nSize);
  }
  pVVar15 = p->vOrderSeqs;
  if (0 < pVVar15->nSize) {
    lVar17 = 0;
    do {
      iVar9 = pVVar15->pArray[lVar17];
      if ((((long)iVar9 < 0) || (p->vIndexes->nSize <= iVar9)) ||
         (uVar8 = p->vIndexes->pArray[iVar9], uVar2 <= uVar8)) {
LAB_0074caad:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Gia_ManAppendCo(p_01,__s[uVar8]);
      lVar17 = lVar17 + 1;
      pVVar15 = p->vOrderSeqs;
    } while (lVar17 < pVVar15->nSize);
  }
  free(__s);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
  }
  free(vMemory);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Gls_ManConstruct( Gls_Man_t * p, char * pFileName )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Gia_Man_t * pGia = NULL;  
    Vec_Int_t * vMap, * vArray;
    Vec_Int_t * vCover = Vec_IntAlloc(0);
    Vec_Int_t * vLeaves = Vec_IntAlloc(6);
    int  k, iObj, iLit, Index;  char Type;
    // create new manager
    pGia = Gia_ManStart( Vec_StrSize(p->vTypes) );
    pGia->pName = Abc_UtilStrsav( pFileName );
    pGia->pSpec = Abc_UtilStrsav( pFileName );
    // create constants
    vMap = Vec_IntStartFull( Vec_StrSize(p->vTypes) );
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    // create primary inputs
    Vec_IntForEachEntry( p->vOrderPis, iObj, k )
        Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    // create box outputs
    Vec_IntForEachEntry( p->vOrderBoxes, iObj, k )
        Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    // create delay outputs
    Vec_IntForEachEntry( p->vOrderDelays, iObj, Index )
    {
        assert( Index == Vec_IntEntry(p->vIndexes, iObj) );
        vArray = Vec_WecEntry(p->vDelayOuts, Index);
        if ( Vec_IntSize(vArray) == 0 )
            Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
        else
            Vec_IntForEachEntry( vArray, iObj, k )
                Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    }
    // construct LUTs
    Vec_IntForEachEntry( p->vOrderLuts, iObj, Index )
    {
        Type = Vec_StrEntry( p->vTypes, iObj );
        if ( Type == GLS_LUT4 || Type == GLS_LUT6 )
        {
            int Limit = Type == GLS_LUT4 ? 4 : 6;
            int Index = Vec_IntEntry(p->vIndexes, iObj);
            int * pFanins = Type == GLS_LUT4 ? Vec_IntEntryP(p->vLut4s, 4*Index) : Vec_IntEntryP(p->vLut6s, 6*Index);
            word Truth = Type == GLS_LUT4 ? (word)Vec_IntEntry(p->vLut4TTs, Index) : Vec_WrdEntry(p->vLut6TTs, Index);
            Vec_IntClear( vLeaves );
            for ( k = 0; k < Limit; k++ )
                Vec_IntPush( vLeaves, pFanins[k] == GLS_NONE ? 0 : Vec_IntEntry(vMap, pFanins[k]) );
            iLit = Kit_TruthToGia( pGia, (unsigned *)&Truth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
            Vec_IntWriteEntry( vMap, iObj, iLit );
        }
        else if ( Type == GLS_BAR || Type == GLS_SEL )
        {
            iLit = Vec_IntEntry( vMap, Vec_IntEntry(p->vIndexes, iObj) );
            Vec_IntWriteEntry( vMap, iObj, iLit );
        }
    }
    // delay inputs
    Vec_IntForEachEntry( p->vOrderDelays, iObj, Index )
    {
        vArray = Vec_WecEntry(p->vDelayIns, Index);
        assert( Vec_IntSize(vArray) > 0 );
        Vec_IntForEachEntry( vArray, iObj, k )
            Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, iObj) );
    }
    // create primary outputs
    Vec_IntForEachEntry( p->vOrderPos, iObj, k )
        Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, Vec_IntEntry(p->vIndexes, iObj)) );
    // create sequential nodes
    Vec_IntForEachEntry( p->vOrderSeqs, iObj, k )
        Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, Vec_IntEntry(p->vIndexes, iObj)) );
    Vec_IntFree( vMap );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // print delay boxes
//    for ( k = 0; k < Vec_IntSize(p->vDelays); k++ )
//        printf( "%d:%d  ", Vec_IntSize(Vec_WecEntry(p->vDelayIns, k)), Vec_IntSize(Vec_WecEntry(p->vDelayOuts, k)) );
//    printf( "\n" );
    return pGia;
}